

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variablebyte.h
# Opt level: O0

uint8_t * __thiscall
FastPForLib::VByte::decodeFromByteArray
          (VByte *this,uint8_t *inbyte,size_t length,uint32_t *out,size_t *nvalue)

{
  byte *pbVar1;
  uint uVar2;
  uint8_t *puVar3;
  uint8_t c_1;
  uint32_t v_1;
  uint shift;
  uint32_t v;
  uint8_t c;
  uint32_t *initout;
  uint8_t *endbyte;
  size_t *nvalue_local;
  uint32_t *out_local;
  size_t length_local;
  uint8_t *inbyte_local;
  VByte *this_local;
  uint8_t *local_8;
  
  if (length == 0) {
    *nvalue = 0;
    local_8 = inbyte;
  }
  else {
    puVar3 = inbyte + length;
    out_local = out;
    inbyte_local = inbyte;
    while (inbyte_local + 5 < puVar3) {
      uVar2 = *inbyte_local & 0x7f;
      if (*inbyte_local < 0x80) {
        inbyte_local = inbyte_local + 1;
        *out_local = uVar2;
        out_local = out_local + 1;
      }
      else {
        uVar2 = (inbyte_local[1] & 0x7f) << 7 | uVar2;
        if (inbyte_local[1] < 0x80) {
          inbyte_local = inbyte_local + 2;
          *out_local = uVar2;
          out_local = out_local + 1;
        }
        else {
          uVar2 = (inbyte_local[2] & 0x7f) << 0xe | uVar2;
          if (inbyte_local[2] < 0x80) {
            inbyte_local = inbyte_local + 3;
            *out_local = uVar2;
            out_local = out_local + 1;
          }
          else {
            uVar2 = (inbyte_local[3] & 0x7f) << 0x15 | uVar2;
            if (inbyte_local[3] < 0x80) {
              inbyte_local = inbyte_local + 4;
              *out_local = uVar2;
              out_local = out_local + 1;
            }
            else {
              pbVar1 = inbyte_local + 4;
              inbyte_local = inbyte_local + 5;
              *out_local = (uint)*pbVar1 << 0x1c | uVar2;
              out_local = out_local + 1;
            }
          }
        }
      }
    }
LAB_0014e770:
    if (inbyte_local < puVar3) {
      shift = 0;
      v_1 = 0;
      while (inbyte_local < puVar3) {
        v_1 = ((*inbyte_local & 0x7f) << ((byte)shift & 0x1f)) + v_1;
        if (*inbyte_local < 0x80) {
          *out_local = v_1;
          out_local = out_local + 1;
          inbyte_local = inbyte_local + 1;
          break;
        }
        shift = shift + 7;
        inbyte_local = inbyte_local + 1;
      }
      goto LAB_0014e770;
    }
    *nvalue = (long)out_local - (long)out >> 2;
    local_8 = inbyte_local;
  }
  return local_8;
}

Assistant:

const uint8_t *decodeFromByteArray(const uint8_t *inbyte, const size_t length,
                                     uint32_t *out, size_t &nvalue) {
    if (length == 0) {
      nvalue = 0;
      return inbyte;  // abort
    }
    const uint8_t *const endbyte = inbyte + length;
    const uint32_t *const initout(out);
    // this assumes that there is a value to be read

    while (endbyte > inbyte + 5) {
      uint8_t c;
      uint32_t v;

      c = inbyte[0];
      v = c & 0x7F;
      if (c < 128) {
        inbyte += 1;
        *out++ = v;
        continue;
      }

      c = inbyte[1];
      v |= (c & 0x7F) << 7;
      if (c < 128) {
        inbyte += 2;
        *out++ = v;
        continue;
      }

      c = inbyte[2];
      v |= (c & 0x7F) << 14;
      if (c < 128) {
        inbyte += 3;
        *out++ = v;
        continue;
      }

      c = inbyte[3];
      v |= (c & 0x7F) << 21;
      if (c < 128) {
        inbyte += 4;
        *out++ = v;
        continue;
      }

      c = inbyte[4];
      inbyte += 5;
      v |= (c & 0x0F) << 28;
      *out++ = v;
    }
    while (endbyte > inbyte) {
      unsigned int shift = 0;
      for (uint32_t v = 0; endbyte > inbyte; shift += 7) {
        uint8_t c = *inbyte++;
        v += ((c & 127) << shift);
        if ((c < 128)) {
          *out++ = v;
          break;
        }
      }
    }
    nvalue = out - initout;
    return inbyte;
  }